

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

iterator __thiscall
spvtools::opt::InlinePass::AddStoresForVariableInitializers
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,DebugInlinedAtContext *inlined_at_ctx,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block_itr)

{
  bool bVar1;
  Instruction *this_00;
  IRContext *pIVar2;
  BasicBlock *new_blk_ptr_00;
  CommonDebugInfoInstructions CVar3;
  uint32_t uVar4;
  const_iterator cVar5;
  uint uVar6;
  Instruction **ppIVar7;
  pointer line_inst;
  long *in_stack_00000010;
  iterator *callee_itr;
  DebugScope local_50;
  InlinePass *local_48;
  iterator local_40;
  uint32_t local_38;
  uint32_t local_34;
  
  ppIVar7 = (Instruction **)(*in_stack_00000010 + 0x20);
  local_48 = (InlinePass *)callee2caller;
  local_40.node_ = (Instruction *)this;
  do {
    this_00 = *ppIVar7;
    if (this_00->opcode_ == OpVariable) {
LAB_0021dc86:
      bVar1 = this_00->has_result_id_;
      uVar6 = (bVar1 & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar6 = (uint)bVar1;
      }
      if ((int)((ulong)((long)(this_00->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar6
          == 2) {
        uVar4 = 0;
        if ((bVar1 & 1U) != 0) {
          uVar4 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
        }
        local_50.lexical_scope_ = uVar4;
        cVar5 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)inlined_at_ctx,&local_50.lexical_scope_);
        if (cVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          ((Pass *)&(local_40.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)->
          _vptr_Pass = (_func_int **)this_00;
          __assert_fail("callee2caller.count(callee_itr->result_id()) && \"Expected the variable to have already been mapped.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp"
                        ,0x142,
                        "InstructionList::iterator spvtools::opt::InlinePass::AddStoresForVariableInitializers(const std::unordered_map<uint32_t, uint32_t> &, analysis::DebugInlinedAtContext *, std::unique_ptr<BasicBlock> *, UptrVectorIterator<BasicBlock>)"
                       );
        }
        uVar4 = 0;
        if (this_00->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
        }
        local_50.lexical_scope_ = uVar4;
        cVar5 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)inlined_at_ctx,&local_50.lexical_scope_);
        if (cVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          ((Pass *)&(local_40.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)->
          _vptr_Pass = (_func_int **)this_00;
          std::__throw_out_of_range("_Map_base::at");
        }
        local_34 = *(uint32_t *)
                    ((long)cVar5.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                           ._M_cur + 0xc);
        uVar6 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar6 = (uint)this_00->has_result_id_;
        }
        local_38 = Instruction::GetSingleWordOperand(this_00,uVar6 + 1);
        line_inst = (this_00->dbg_line_insts_).
                    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        if (line_inst ==
            (this_00->dbg_line_insts_).
            super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          line_inst = (Instruction *)0x0;
        }
        pIVar2 = (IRContext *)
                 (((_Hashtable *)&local_48->super_Pass)->_M_rehash_policy)._M_next_resize;
        if ((pIVar2->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
          IRContext::BuildDebugInfoManager(pIVar2);
        }
        local_50 = analysis::DebugInfoManager::BuildDebugScope
                             ((pIVar2->debug_info_mgr_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                              .
                              super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                              ._M_head_impl,&this_00->dbg_scope_,
                              (DebugInlinedAtContext *)new_blk_ptr);
        AddStore(local_48,local_34,local_38,
                 (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  *)callee_first_block_itr.container_,line_inst,&local_50);
      }
    }
    else {
      CVar3 = Instruction::GetCommonDebugOpcode(this_00);
      if (CVar3 != CommonDebugInfoDebugDeclare) {
        ((local_40.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase = (_func_int **)this_00;
        return (iterator)(iterator)local_40.node_;
      }
      if (this_00->opcode_ == OpVariable) goto LAB_0021dc86;
    }
    CVar3 = Instruction::GetCommonDebugOpcode(this_00);
    if (CVar3 == CommonDebugInfoDebugDeclare) {
      new_blk_ptr_00 =
           (((_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              *)&((callee_first_block_itr.container_)->
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->
           super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>)._M_head_impl;
      pIVar2 = (IRContext *)(((_Hashtable *)&local_48->super_Pass)->_M_rehash_policy)._M_next_resize
      ;
      if ((pIVar2->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
        IRContext::BuildDebugInfoManager(pIVar2);
      }
      uVar4 = analysis::DebugInfoManager::BuildDebugInlinedAtChain
                        ((pIVar2->debug_info_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                         _M_head_impl,(this_00->dbg_scope_).inlined_at_,
                         (DebugInlinedAtContext *)new_blk_ptr);
      InlineSingleInstruction
                (local_48,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)inlined_at_ctx,new_blk_ptr_00,this_00,uVar4);
    }
    ppIVar7 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

InstructionList::iterator InlinePass::AddStoresForVariableInitializers(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    analysis::DebugInlinedAtContext* inlined_at_ctx,
    std::unique_ptr<BasicBlock>* new_blk_ptr,
    UptrVectorIterator<BasicBlock> callee_first_block_itr) {
  auto callee_itr = callee_first_block_itr->begin();
  while (callee_itr->opcode() == spv::Op::OpVariable ||
         callee_itr->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare) {
    if (callee_itr->opcode() == spv::Op::OpVariable &&
        callee_itr->NumInOperands() == 2) {
      assert(callee2caller.count(callee_itr->result_id()) &&
             "Expected the variable to have already been mapped.");
      uint32_t new_var_id = callee2caller.at(callee_itr->result_id());

      // The initializer must be a constant or global value.  No mapped
      // should be used.
      uint32_t val_id = callee_itr->GetSingleWordInOperand(1);
      AddStore(new_var_id, val_id, new_blk_ptr, callee_itr->dbg_line_inst(),
               context()->get_debug_info_mgr()->BuildDebugScope(
                   callee_itr->GetDebugScope(), inlined_at_ctx));
    }
    if (callee_itr->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare) {
      InlineSingleInstruction(
          callee2caller, new_blk_ptr->get(), &*callee_itr,
          context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
              callee_itr->GetDebugScope().GetInlinedAt(), inlined_at_ctx));
    }
    ++callee_itr;
  }
  return callee_itr;
}